

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O2

void __thiscall pmx::PmxModel::Init(PmxModel *this)

{
  this->version = 0.0;
  (this->model_name)._M_string_length = 0;
  *(this->model_name)._M_dataplus._M_p = '\0';
  (this->model_english_name)._M_string_length = 0;
  *(this->model_english_name)._M_dataplus._M_p = '\0';
  (this->model_comment)._M_string_length = 0;
  *(this->model_comment)._M_dataplus._M_p = '\0';
  (this->model_english_comment)._M_string_length = 0;
  *(this->model_english_comment)._M_dataplus._M_p = '\0';
  this->vertex_count = 0;
  std::__uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>::reset
            ((__uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_> *)
             &this->vertices,(pointer)0x0);
  this->index_count = 0;
  std::__uniq_ptr_impl<int,_std::default_delete<int[]>_>::reset
            ((__uniq_ptr_impl<int,_std::default_delete<int[]>_> *)&this->indices,(pointer)0x0);
  this->texture_count = 0;
  std::
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
  ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
           *)&this->textures,(pointer)0x0);
  this->material_count = 0;
  std::__uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>::reset
            ((__uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_> *)
             &this->materials,(pointer)0x0);
  this->bone_count = 0;
  std::__uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>::reset
            ((__uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_> *)&this->bones,
             (pointer)0x0);
  this->morph_count = 0;
  std::__uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_>::reset
            ((__uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_> *)&this->morphs,
             (pointer)0x0);
  this->frame_count = 0;
  std::__uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_>::reset
            ((__uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_> *)&this->frames,
             (pointer)0x0);
  this->rigid_body_count = 0;
  std::__uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_>::reset
            ((__uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_> *)
             &this->rigid_bodies,(pointer)0x0);
  this->joint_count = 0;
  std::__uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_>::reset
            ((__uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_> *)&this->joints,
             (pointer)0x0);
  this->soft_body_count = 0;
  std::__uniq_ptr_impl<pmx::PmxSoftBody,_std::default_delete<pmx::PmxSoftBody[]>_>::reset
            ((__uniq_ptr_impl<pmx::PmxSoftBody,_std::default_delete<pmx::PmxSoftBody[]>_> *)
             &this->soft_bodies,(pointer)0x0);
  return;
}

Assistant:

void PmxModel::Init()
	{
		this->version = 0.0f;
		this->model_name.clear();
		this->model_english_name.clear();
		this->model_comment.clear();
		this->model_english_comment.clear();
		this->vertex_count = 0;
		this->vertices = nullptr;
		this->index_count = 0;
		this->indices = nullptr;
		this->texture_count = 0;
		this->textures = nullptr;
		this->material_count = 0;
		this->materials = nullptr;
		this->bone_count = 0;
		this->bones = nullptr;
		this->morph_count = 0;
		this->morphs = nullptr;
		this->frame_count = 0;
		this->frames = nullptr;
		this->rigid_body_count = 0;
		this->rigid_bodies = nullptr;
		this->joint_count = 0;
		this->joints = nullptr;
		this->soft_body_count = 0;
		this->soft_bodies = nullptr;
	}